

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall
ASDCP::MXF::JPEG2000PictureSubDescriptor::JPEG2000PictureSubDescriptor
          (JPEG2000PictureSubDescriptor *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  MDDEntry *pMVar3;
  
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__JPEG2000PictureSubDescriptor_00225a90;
  this->Rsize = 0;
  this->Xsize = 0;
  this->Ysize = 0;
  this->XOsize = 0;
  this->YOsize = 0;
  this->XTsize = 0;
  this->YTsize = 0;
  this->XTOsize = 0;
  this->YTOsize = 0;
  this->Csize = 0;
  Raw::Raw(&(this->PictureComponentSizing).m_property);
  (this->PictureComponentSizing).m_has_value = false;
  Raw::Raw(&(this->CodingStyleDefault).m_property);
  (this->CodingStyleDefault).m_has_value = false;
  Raw::Raw(&(this->QuantizationDefault).m_property);
  (this->QuantizationDefault).m_has_value = false;
  RGBALayout::RGBALayout(&(this->J2CLayout).m_property);
  (this->J2CLayout).m_has_value = false;
  (this->J2KExtendedCapabilities).m_property.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__J2KExtendedCapabilitiesType_00223b70;
  (this->J2KExtendedCapabilities).m_property.Ccap.
  super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
  .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
  super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->J2KExtendedCapabilities).m_property.Ccap.
           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
           .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
           super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl +
   8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->J2KExtendedCapabilities).m_property.Ccap.
           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
           .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
           super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl +
   0x10) = (pointer)0x0;
  (this->J2KExtendedCapabilities).m_property.Ccap.
  super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
  .super_IArchive._vptr_IArchive = (_func_int **)&PTR__FixedSizeItemCollection_002279e8;
  (this->J2KExtendedCapabilities).m_has_value = false;
  (this->J2KProfile).m_property.
  super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
  .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
  super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->J2KProfile).m_property.
           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
           .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
           super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->J2KProfile).m_property.
           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
           .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
           super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->J2KProfile).m_property.
  super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
  .super_IArchive._vptr_IArchive = (_func_int **)&PTR__FixedSizeItemCollection_002279e8;
  (this->J2KProfile).m_has_value = false;
  (this->J2KCorrespondingProfile).m_property.
  super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
  .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
  super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->J2KCorrespondingProfile).m_property.
           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
           .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
           super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->J2KCorrespondingProfile).m_property.
           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
           .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
           super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->J2KCorrespondingProfile).m_property.
  super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
  .super_IArchive._vptr_IArchive = (_func_int **)&PTR__FixedSizeItemCollection_002279e8;
  (this->J2KCorrespondingProfile).m_has_value = false;
  this_00 = (this->super_InterchangeObject).m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar3 = Dictionary::Type(this_00,MDD_JPEG2000PictureSubDescriptor);
    uVar1 = *(undefined8 *)pMVar3->ul;
    uVar2 = *(undefined8 *)(pMVar3->ul + 8);
    (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) =
         uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x8af,
                "ASDCP::MXF::JPEG2000PictureSubDescriptor::JPEG2000PictureSubDescriptor(const Dictionary *)"
               );
}

Assistant:

JPEG2000PictureSubDescriptor::JPEG2000PictureSubDescriptor(const Dictionary* d) : InterchangeObject(d), Rsize(0), Xsize(0), Ysize(0), XOsize(0), YOsize(0), XTsize(0), YTsize(0), XTOsize(0), YTOsize(0), Csize(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_JPEG2000PictureSubDescriptor);
}